

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op_arith_compute_ov
               (DisasContext_conflict10 *ctx,TCGv_i64 arg0,TCGv_i64 arg1,TCGv_i64 arg2,int sub)

{
  TCGContext_conflict10 *s;
  TCGTemp *a1;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)(cpu_ov + (long)s),(TCGArg)(arg0 + (long)s),
                    (TCGArg)(arg2 + (long)s));
  tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)(arg1 + (long)s),(TCGArg)(arg2 + (long)s))
  ;
  if (sub == 0) {
    tcg_gen_andc_i64_ppc64(s,cpu_ov,cpu_ov,(TCGv_i64)((long)a1 - (long)s));
  }
  else {
    tcg_gen_op3_ppc64(s,INDEX_op_and_i64,(TCGArg)(cpu_ov + (long)s),(TCGArg)(cpu_ov + (long)s),
                      (TCGArg)a1);
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
  if (ctx->sf_mode == false) {
    tcg_gen_extract_i64_ppc64(s,cpu_ov,cpu_ov,0x1f,1);
    if ((ctx->insns_flags2 & 0x80000) != 0) {
      if (cpu_ov32 != cpu_ov) {
        tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)(cpu_ov32 + (long)s),(TCGArg)(cpu_ov + (long)s)
                         );
      }
    }
  }
  else {
    if ((ctx->insns_flags2 & 0x80000) != 0) {
      tcg_gen_extract_i64_ppc64(s,cpu_ov32,cpu_ov,0x1f,1);
    }
    tcg_gen_extract_i64_ppc64(s,cpu_ov,cpu_ov,0x3f,1);
  }
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)(cpu_so + (long)s),(TCGArg)(cpu_so + (long)s),
                    (TCGArg)(cpu_ov + (long)s));
  return;
}

Assistant:

static inline void gen_op_arith_compute_ov(DisasContext *ctx, TCGv arg0,
                                           TCGv arg1, TCGv arg2, int sub)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    tcg_gen_xor_tl(tcg_ctx, cpu_ov, arg0, arg2);
    tcg_gen_xor_tl(tcg_ctx, t0, arg1, arg2);
    if (sub) {
        tcg_gen_and_tl(tcg_ctx, cpu_ov, cpu_ov, t0);
    } else {
        tcg_gen_andc_tl(tcg_ctx, cpu_ov, cpu_ov, t0);
    }
    tcg_temp_free(tcg_ctx, t0);
    if (NARROW_MODE(ctx)) {
        tcg_gen_extract_tl(tcg_ctx, cpu_ov, cpu_ov, 31, 1);
        if (is_isa300(ctx)) {
            tcg_gen_mov_tl(tcg_ctx, cpu_ov32, cpu_ov);
        }
    } else {
        if (is_isa300(ctx)) {
            tcg_gen_extract_tl(tcg_ctx, cpu_ov32, cpu_ov, 31, 1);
        }
        tcg_gen_extract_tl(tcg_ctx, cpu_ov, cpu_ov, TARGET_LONG_BITS - 1, 1);
    }
    tcg_gen_or_tl(tcg_ctx, cpu_so, cpu_so, cpu_ov);
}